

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O0

void virtio_legacy_setup_rx_queue(virtio_device *dev,uint16_t idx)

{
  vring_used *pvVar1;
  uint16_t uVar2;
  uint32_t num;
  size_t sVar3;
  vring *vr;
  mempool *pmVar4;
  short in_SI;
  long in_RDI;
  dma_memory dVar5;
  size_t i;
  virtqueue *vq;
  dma_memory mem;
  size_t virt_queue_mem_size;
  uint32_t notify_offset;
  uint32_t max_queue_size;
  undefined1 in_stack_0000184f;
  size_t in_stack_00001850;
  size_t in_stack_ffffffffffffffa8;
  uint8_t *__s;
  undefined8 in_stack_ffffffffffffffb0;
  ulong local_40;
  uint8_t *p;
  
  if (in_SI == 0) {
    write_io16((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
               (uint16_t)((ulong)in_stack_ffffffffffffffb0 >> 0x10),in_stack_ffffffffffffffa8);
    num = read_io32((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),in_stack_ffffffffffffffa8);
    sVar3 = CONCAT44((int)(in_stack_ffffffffffffffa8 >> 0x20),num);
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Max queue size of rx queue #%u: %u\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/virtio.c"
            ,0xe4,"virtio_legacy_setup_rx_queue",0);
    if (num != 0) {
      uVar2 = read_io16((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),sVar3);
      fprintf(_stderr,"[DEBUG] %s:%d %s(): Notifcation offset %u\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/virtio.c"
              ,0xe9,"virtio_legacy_setup_rx_queue",(ulong)(uint)uVar2);
      sVar3 = virtio_legacy_vring_size(num,0x1000);
      dVar5 = memory_allocate_dma(in_stack_00001850,(_Bool)in_stack_0000184f);
      __s = (uint8_t *)dVar5.virt;
      memset(__s,0xab,sVar3);
      p = __s;
      fprintf(_stderr,"[DEBUG] %s:%d %s(): Allocated %zu bytes for virt queue at %p\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/virtio.c"
              ,0xed,"virtio_legacy_setup_rx_queue",sVar3);
      write_io32((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(uint32_t)in_stack_ffffffffffffffb0
                 ,(size_t)__s);
      vr = (vring *)calloc(1,(ulong)num * 8 + 0x38);
      virtio_legacy_vring_init(vr,num,p,0x1000);
      fprintf(_stderr,"[DEBUG] %s:%d %s(): vring desc: %p, vring avail: %p, vring used: %p\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/virtio.c"
              ,0xf3,"virtio_legacy_setup_rx_queue",vr->desc,vr->avail,vr->used);
      for (local_40 = 0; local_40 < vr->num; local_40 = local_40 + 1) {
        vr->desc[local_40].len = 0;
        vr->desc[local_40].addr = 0;
        vr->desc[local_40].flags = 0;
        vr->desc[local_40].next = 0;
        (&vr->avail[1].flags)[local_40] = 0;
        pvVar1 = vr->used;
        pvVar1[local_40 * 2 + 1].flags = 0;
        pvVar1[local_40 * 2 + 1].idx = 0;
        pvVar1 = vr->used;
        pvVar1[local_40 * 2 + 2].flags = 0;
        pvVar1[local_40 * 2 + 2].idx = 0;
      }
      vr->used->idx = 0;
      vr->avail->idx = 0;
      *(undefined2 *)&vr[1].desc = 0;
      *(ulong *)(vr + 1) = (ulong)(uint)uVar2;
      vr->avail->flags = 1;
      vr->used->flags = 0;
      pmVar4 = memory_allocate_mempool((uint32_t)((ulong)p >> 0x20),(uint32_t)p);
      vr[1].avail = (vring_avail *)pmVar4;
      *(vring **)(in_RDI + 0x48) = vr;
    }
    return;
  }
  fprintf(_stderr,"[ERROR] %s:%d %s(): Can\'t setup Tx queue as Rx\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/virtio.c"
          ,0xde,"virtio_legacy_setup_rx_queue");
  abort();
}

Assistant:

static void virtio_legacy_setup_rx_queue(struct virtio_device* dev, uint16_t idx) {
	if (idx != 0) {
		error("Can't setup Tx queue as Rx");
	}

	// Create virt queue itself - Section 4.1.5.1.3
	write_io16(dev->fd, idx, VIRTIO_PCI_QUEUE_SEL);
	uint32_t max_queue_size = read_io32(dev->fd, VIRTIO_PCI_QUEUE_NUM);
	debug("Max queue size of rx queue #%u: %u", idx, max_queue_size);
	if (max_queue_size == 0) {
		return;
	}
	uint32_t notify_offset = read_io16(dev->fd, VIRTIO_PCI_QUEUE_NOTIFY);
	debug("Notifcation offset %u", notify_offset);
	size_t virt_queue_mem_size = virtio_legacy_vring_size(max_queue_size, 4096);
	struct dma_memory mem = memory_allocate_dma(virt_queue_mem_size, true);
	memset(mem.virt, 0xab, virt_queue_mem_size);
	debug("Allocated %zu bytes for virt queue at %p", virt_queue_mem_size, mem.virt);
	write_io32(dev->fd, mem.phy >> VIRTIO_PCI_QUEUE_ADDR_SHIFT, VIRTIO_PCI_QUEUE_PFN);

	// Section 2.4.2 for layout
	struct virtqueue* vq = calloc(1, sizeof(*vq) + sizeof(void*) * max_queue_size);
	virtio_legacy_vring_init(&vq->vring, max_queue_size, mem.virt, 4096);
	debug("vring desc: %p, vring avail: %p, vring used: %p", vq->vring.desc, vq->vring.avail, vq->vring.used);
	for (size_t i = 0; i < vq->vring.num; ++i) {
		vq->vring.desc[i].len = 0;
		vq->vring.desc[i].addr = 0;
		vq->vring.desc[i].flags = 0;
		vq->vring.desc[i].next = 0;
		vq->vring.avail->ring[i] = 0;
		vq->vring.used->ring[i].id = 0;
		vq->vring.used->ring[i].len = 0;
	}
	vq->vring.used->idx = 0;
	vq->vring.avail->idx = 0;
	vq->vq_used_last_idx = 0;

	// Section 4.1.4.4
	vq->notification_offset = notify_offset;

	// Disable interrupts - Section 2.4.7
	vq->vring.avail->flags = VRING_AVAIL_F_NO_INTERRUPT;
	vq->vring.used->flags = 0;

	// Allocate buffers and fill descriptor table - Section 3.2.1
	// We allocate more bufs than what would fit in the queue,
	// because we don't want to stall rx if users hold bufs for longer
	vq->mempool = memory_allocate_mempool(max_queue_size * 4, 2048);

	dev->rx_queue = vq;
}